

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  secp256k1_modinv64_signed62 *in_RSI;
  secp256k1_scalar *in_RDI;
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_modinfo *in_stack_00000098;
  secp256k1_modinv64_signed62 *in_stack_000000a0;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffe8;
  
  secp256k1_scalar_verify((secp256k1_scalar *)in_RSI);
  secp256k1_scalar_to_signed62(in_RSI,(secp256k1_scalar *)in_stack_ffffffffffffffe8);
  secp256k1_modinv64(in_stack_000000a0,in_stack_00000098);
  secp256k1_scalar_from_signed62((secp256k1_scalar *)in_RSI,in_stack_ffffffffffffffe8);
  secp256k1_scalar_verify(in_RDI);
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}